

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerDatasetFromJson
                  (Error *__return_storage_ptr__,CommissionerDataset *aDataset,string *aJson)

{
  json_value *this;
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  format_args args;
  JsonException *e;
  exception *e_1;
  anon_class_1_0_00000001 local_1f2;
  v10 local_1f1;
  v10 *local_1f0;
  size_t local_1e8;
  string local_1e0;
  Error local_1c0;
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  local_198;
  string local_168;
  input_adapter local_148;
  undefined1 local_138 [8];
  Json json;
  string *aJson_local;
  CommissionerDataset *aDataset_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  Error::Error(__return_storage_ptr__);
  json.m_value.object = (object_t *)0x0;
  this = &json.m_value;
  CommissionerDataset::CommissionerDataset((CommissionerDataset *)this);
  CommissionerDataset::operator=(aDataset,(CommissionerDataset *)this);
  CommissionerDataset::~CommissionerDataset((CommissionerDataset *)this);
  StripComments(&local_168,aJson);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_148,&local_168);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::function(&local_198,(nullptr_t)0x0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_138,&local_148,&local_198,true);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::~function(&local_198);
  nlohmann::detail::input_adapter::~input_adapter(&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::is_null((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_138);
  if (bVar1) {
    CommissionerDatasetFromJson::anon_class_1_0_00000001::operator()(&local_1f2);
    local_58 = &local_1f0;
    local_60 = &local_1f1;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_1e8 = bVar2.size_;
    local_1f0 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_1e0;
    local_78 = local_1f0;
    sStack_70 = local_1e8;
    local_50 = &local_78;
    local_88 = local_1f0;
    local_80 = local_1e8;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_1e0,local_88,fmt,args);
    Error::Error(&local_1c0,kNotFound,&local_1e0);
    Error::operator=(__return_storage_ptr__,&local_1c0);
    Error::~Error(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator_CommissionerDataset<ot::commissioner::CommissionerDataset,_0>
              ((CommissionerDataset *)&e_1,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_138);
    CommissionerDataset::operator=(aDataset,(CommissionerDataset *)&e_1);
    CommissionerDataset::~CommissionerDataset((CommissionerDataset *)&e_1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_138);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerDatasetFromJson(CommissionerDataset &aDataset, const std::string &aJson)
{
    Error error;

    aDataset = CommissionerDataset{};

    try
    {
        Json json = Json::parse(StripComments(aJson));
        if (json.is_null())
        {
            error = ERROR_NOT_FOUND("Empty commissioner dataset JSON");
        }
        else
        {
            aDataset = json;
        }
    } catch (JsonException &e)
    {
        error = e.GetError();
    } catch (std::exception &e)
    {
        error = {ErrorCode::kInvalidArgs, e.what()};
    }

    return error;
}